

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsonParser.h
# Opt level: O2

void __thiscall Json::JsonParser::JsonParser(JsonParser *this,ifstream *ifs)

{
  (this->__buffer_value)._M_dataplus._M_p = (pointer)&(this->__buffer_value).field_2;
  (this->__buffer_value)._M_string_length = 0;
  (this->__buffer_value).field_2._M_local_buf[0] = '\0';
  (this->jsonValue).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->jsonValue).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->jsonValue).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  JsonReader::JsonReader(&this->__reader,ifs);
  this->__escape = false;
  this->__parser = false;
  return;
}

Assistant:

explicit JsonParser(std::ifstream &ifs) : __reader(ifs) {}